

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_tdef.c
# Opt level: O3

tdefl_status tdefl_flush_output_buffer(tdefl_compressor *d)

{
  tdefl_status tVar1;
  ulong __n;
  size_t sVar2;
  
  if (d->m_pIn_buf_size != (size_t *)0x0) {
    *d->m_pIn_buf_size = (long)d->m_pSrc - (long)d->m_pIn_buf;
  }
  if (d->m_pOut_buf_size != (size_t *)0x0) {
    __n = *d->m_pOut_buf_size - d->m_out_buf_ofs;
    if (d->m_output_flush_remaining <= __n) {
      __n = (ulong)d->m_output_flush_remaining;
    }
    memcpy((void *)(d->m_out_buf_ofs + (long)d->m_pOut_buf),d->m_output_buf + d->m_output_flush_ofs,
           __n);
    d->m_output_flush_ofs = d->m_output_flush_ofs + (int)__n;
    d->m_output_flush_remaining = d->m_output_flush_remaining - (int)__n;
    sVar2 = __n + d->m_out_buf_ofs;
    d->m_out_buf_ofs = sVar2;
    *d->m_pOut_buf_size = sVar2;
  }
  if (d->m_finished == 0) {
    tVar1 = TDEFL_STATUS_OKAY;
  }
  else {
    tVar1 = (tdefl_status)(d->m_output_flush_remaining == 0);
  }
  return tVar1;
}

Assistant:

static tdefl_status tdefl_flush_output_buffer(tdefl_compressor *d)
{
    if (d->m_pIn_buf_size)
    {
        *d->m_pIn_buf_size = d->m_pSrc - (const mz_uint8 *)d->m_pIn_buf;
    }

    if (d->m_pOut_buf_size)
    {
        size_t n = MZ_MIN(*d->m_pOut_buf_size - d->m_out_buf_ofs, d->m_output_flush_remaining);
        memcpy((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs, d->m_output_buf + d->m_output_flush_ofs, n);
        d->m_output_flush_ofs += (mz_uint)n;
        d->m_output_flush_remaining -= (mz_uint)n;
        d->m_out_buf_ofs += n;

        *d->m_pOut_buf_size = d->m_out_buf_ofs;
    }

    return (d->m_finished && !d->m_output_flush_remaining) ? TDEFL_STATUS_DONE : TDEFL_STATUS_OKAY;
}